

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

wchar_t cleanup_pathname(archive_write_disk *a)

{
  archive *in_RDI;
  bool bVar1;
  char separator;
  char *src;
  char *dest;
  char local_21;
  char *local_20;
  char *local_18;
  
  local_21 = '\0';
  local_18 = (char *)in_RDI[3].error_string.length;
  if (*local_18 == '\0') {
    archive_set_error(in_RDI,-1,"Invalid empty pathname");
    return L'\xffffffe7';
  }
  local_20 = local_18;
  if (*local_18 == '/') {
    local_20 = local_18 + 1;
    local_21 = *local_18;
  }
  while (*local_20 != '\0') {
    if (*local_20 == '/') {
      local_20 = local_20 + 1;
    }
    else if (*local_20 == '.') {
      if (local_20[1] == '\0') break;
      if (local_20[1] != '/') {
        if ((local_20[1] == '.') &&
           (((local_20[2] == '/' || (local_20[2] == '\0')) && ((in_RDI[4].magic & 0x200) != 0)))) {
          archive_set_error(in_RDI,-1,"Path contains \'..\'");
          return L'\xffffffe7';
        }
        goto LAB_0016b14f;
      }
      local_20 = local_20 + 2;
    }
    else {
LAB_0016b14f:
      if (local_21 != '\0') {
        *local_18 = '/';
        local_18 = local_18 + 1;
      }
      while( true ) {
        bVar1 = false;
        if (*local_20 != '\0') {
          bVar1 = *local_20 != '/';
        }
        if (!bVar1) break;
        *local_18 = *local_20;
        local_20 = local_20 + 1;
        local_18 = local_18 + 1;
      }
      if (*local_20 == '\0') break;
      local_21 = *local_20;
      local_20 = local_20 + 1;
    }
  }
  if (local_18 == (char *)in_RDI[3].error_string.length) {
    if (local_21 == '\0') {
      *local_18 = '.';
    }
    else {
      *local_18 = '/';
    }
    local_18 = local_18 + 1;
  }
  *local_18 = '\0';
  return L'\0';
}

Assistant:

static int
cleanup_pathname(struct archive_write_disk *a)
{
	char *dest, *src;
	char separator = '\0';

	dest = src = a->name;
	if (*src == '\0') {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Invalid empty pathname");
		return (ARCHIVE_FAILED);
	}

#if defined(__CYGWIN__)
	cleanup_pathname_win(a);
#endif
	/* Skip leading '/'. */
	if (*src == '/')
		separator = *src++;

	/* Scan the pathname one element at a time. */
	for (;;) {
		/* src points to first char after '/' */
		if (src[0] == '\0') {
			break;
		} else if (src[0] == '/') {
			/* Found '//', ignore second one. */
			src++;
			continue;
		} else if (src[0] == '.') {
			if (src[1] == '\0') {
				/* Ignore trailing '.' */
				break;
			} else if (src[1] == '/') {
				/* Skip './'. */
				src += 2;
				continue;
			} else if (src[1] == '.') {
				if (src[2] == '/' || src[2] == '\0') {
					/* Conditionally warn about '..' */
					if (a->flags & ARCHIVE_EXTRACT_SECURE_NODOTDOT) {
						archive_set_error(&a->archive,
						    ARCHIVE_ERRNO_MISC,
						    "Path contains '..'");
						return (ARCHIVE_FAILED);
					}
				}
				/*
				 * Note: Under no circumstances do we
				 * remove '..' elements.  In
				 * particular, restoring
				 * '/foo/../bar/' should create the
				 * 'foo' dir as a side-effect.
				 */
			}
		}

		/* Copy current element, including leading '/'. */
		if (separator)
			*dest++ = '/';
		while (*src != '\0' && *src != '/') {
			*dest++ = *src++;
		}

		if (*src == '\0')
			break;

		/* Skip '/' separator. */
		separator = *src++;
	}
	/*
	 * We've just copied zero or more path elements, not including the
	 * final '/'.
	 */
	if (dest == a->name) {
		/*
		 * Nothing got copied.  The path must have been something
		 * like '.' or '/' or './' or '/././././/./'.
		 */
		if (separator)
			*dest++ = '/';
		else
			*dest++ = '.';
	}
	/* Terminate the result. */
	*dest = '\0';
	return (ARCHIVE_OK);
}